

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  uint x;
  uint y;
  stbi_uc *psVar4;
  byte *pbVar5;
  long lVar6;
  char *pcVar7;
  uchar *puVar8;
  stbi_uc *psVar9;
  uint uVar10;
  byte *pbVar11;
  ulong uVar12;
  int iVar13;
  uint req_comp_00;
  byte *pbVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uchar *local_b8;
  stbi_uc local_9c [4];
  stbi_uc *local_98;
  long local_90;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  psVar4 = s->img_buffer;
  iVar13 = 0x5c;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    if (psVar4 < s->img_buffer_end) {
LAB_0011ca17:
      psVar4 = psVar4 + 1;
      s->img_buffer = psVar4;
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar4 = s->img_buffer;
      goto LAB_0011ca17;
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011ca58:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_0011cc7a:
      pcVar7 = "bad file";
      goto LAB_0011cc93;
    }
  }
  else {
    iVar13 = (*(s->io).eof)(s->io_user_data);
    if (iVar13 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_0011ca58;
      goto LAB_0011cc7a;
    }
  }
  if ((y == 0) || ((x <= 0x7fffffff / y && (y * x < 0x20000000)))) {
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    stbi__get16be(s);
    req_comp_00 = 0;
    local_b8 = (uchar *)stbi__malloc_mad3(x,y,4,0);
    if (local_b8 != (uchar *)0x0) {
      memset(local_b8,0xff,(ulong)(y * x * 4));
      pbVar14 = (byte *)(local_57 + 1);
      lVar6 = 0;
      do {
        if (lVar6 == 10) {
LAB_0011cca0:
          pcVar7 = "bad format";
LAB_0011ccb0:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar7;
LAB_0011cccc:
          free(local_b8);
          local_b8 = (uchar *)0x0;
          goto LAB_0011ccdf;
        }
        pbVar5 = s->img_buffer;
        pbVar11 = s->img_buffer_end;
        local_90 = lVar6;
        if (pbVar5 < pbVar11) {
LAB_0011cb4d:
          s->img_buffer = pbVar5 + 1;
          bVar20 = *pbVar5 == 0;
          pbVar5 = pbVar5 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar5 = s->img_buffer;
            pbVar11 = s->img_buffer_end;
            goto LAB_0011cb4d;
          }
          bVar20 = true;
        }
        if (pbVar5 < pbVar11) {
LAB_0011cb88:
          s->img_buffer = pbVar5 + 1;
          bVar3 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar5 = s->img_buffer;
            pbVar11 = s->img_buffer_end;
            goto LAB_0011cb88;
          }
          bVar3 = 0;
        }
        pbVar14[-2] = bVar3;
        if (pbVar5 < pbVar11) {
LAB_0011cbc3:
          s->img_buffer = pbVar5 + 1;
          bVar17 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar5 = s->img_buffer;
            pbVar11 = s->img_buffer_end;
            goto LAB_0011cbc3;
          }
          bVar17 = 0;
        }
        pbVar14[-1] = bVar17;
        if (pbVar5 < pbVar11) {
LAB_0011cbf5:
          s->img_buffer = pbVar5 + 1;
          bVar17 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar5 = s->img_buffer;
            goto LAB_0011cbf5;
          }
          bVar17 = 0;
        }
        *pbVar14 = bVar17;
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011cc2f:
          if (pbVar5 < s->img_buffer_end) goto LAB_0011cc38;
LAB_0011cca9:
          pcVar7 = "bad file";
          goto LAB_0011ccb0;
        }
        iVar13 = (*(s->io).eof)(s->io_user_data);
        if (iVar13 != 0) {
          if (s->read_from_callbacks != 0) {
            pbVar5 = s->img_buffer;
            goto LAB_0011cc2f;
          }
          goto LAB_0011cca9;
        }
LAB_0011cc38:
        if (bVar3 != 8) goto LAB_0011cca0;
        req_comp_00 = req_comp_00 | bVar17;
        pbVar14 = pbVar14 + 3;
        lVar6 = local_90 + 1;
      } while (!bVar20);
      req_comp_00 = 4 - ((req_comp_00 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = req_comp_00;
      }
      if (y != 0) {
        local_84 = x * 4;
        local_80 = (ulong)y;
        uVar12 = 0;
        local_90 = lVar6;
        do {
          local_98 = local_b8 + local_84 * (int)uVar12;
          lVar6 = 0;
          local_78 = uVar12;
          do {
            lVar2 = lVar6 * 3;
            cVar1 = local_57[lVar2];
            local_70 = lVar6;
            if (cVar1 == '\0') {
              if (x != 0) {
                bVar3 = local_57[lVar2 + 1];
                psVar4 = local_98;
                uVar19 = x;
                do {
                  psVar9 = stbi__readval(s,(uint)bVar3,psVar4);
                  if (psVar9 == (stbi_uc *)0x0) goto LAB_0011cccc;
                  psVar4 = psVar4 + 4;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
            }
            else if (cVar1 == '\x01') {
              psVar4 = local_98;
              uVar19 = x;
              if (x != 0) {
                do {
                  pbVar14 = s->img_buffer;
                  if (pbVar14 < s->img_buffer_end) {
LAB_0011cf51:
                    s->img_buffer = pbVar14 + 1;
                    bVar3 = *pbVar14;
                    pbVar14 = pbVar14 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar14 = s->img_buffer;
                      goto LAB_0011cf51;
                    }
                    bVar3 = 0;
                  }
                  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011cf87:
                    if (s->img_buffer_end <= pbVar14) {
LAB_0011d078:
                      *(char **)(in_FS_OFFSET + -0x20) = "bad file";
                      goto LAB_0011cccc;
                    }
                  }
                  else {
                    iVar13 = (*(s->io).eof)(s->io_user_data);
                    if (iVar13 != 0) {
                      if (s->read_from_callbacks != 0) {
                        pbVar14 = s->img_buffer;
                        goto LAB_0011cf87;
                      }
                      goto LAB_0011d078;
                    }
                  }
                  psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_9c);
                  if (psVar9 == (stbi_uc *)0x0) goto LAB_0011cccc;
                  if (uVar19 < bVar3) {
                    bVar3 = (byte)uVar19;
                  }
                  uVar16 = (uint)bVar3;
                  if (bVar3 != 0) {
                    uVar10 = 0;
                    do {
                      bVar3 = local_57[lVar2 + 1];
                      uVar15 = 0x80;
                      lVar6 = 0;
                      do {
                        if ((uVar15 & bVar3) != 0) {
                          psVar4[lVar6] = local_9c[lVar6];
                        }
                        lVar6 = lVar6 + 1;
                        uVar15 = uVar15 >> 1;
                      } while (lVar6 != 4);
                      uVar10 = uVar10 + 1;
                      psVar4 = psVar4 + 4;
                    } while (uVar10 != uVar16);
                  }
                  uVar10 = uVar19 - uVar16;
                  bVar20 = (int)uVar16 <= (int)uVar19;
                  uVar19 = uVar10;
                } while (uVar10 != 0 && bVar20);
              }
            }
            else {
              if (cVar1 != '\x02') {
                *(char **)(in_FS_OFFSET + -0x20) = "bad format";
                goto LAB_0011cccc;
              }
              psVar4 = local_98;
              uVar19 = x;
              if (x != 0) {
                do {
                  pbVar14 = s->img_buffer;
                  if (pbVar14 < s->img_buffer_end) {
LAB_0011ce00:
                    s->img_buffer = pbVar14 + 1;
                    bVar3 = *pbVar14;
                    pbVar14 = pbVar14 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar14 = s->img_buffer;
                      goto LAB_0011ce00;
                    }
                    bVar3 = 0;
                  }
                  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
                    iVar13 = (*(s->io).eof)(s->io_user_data);
                    if (iVar13 == 0) goto LAB_0011ce48;
                    if (s->read_from_callbacks != 0) {
                      pbVar14 = s->img_buffer;
                      goto LAB_0011ce3b;
                    }
LAB_0011d098:
                    *(char **)(in_FS_OFFSET + -0x20) = "bad file";
                    goto LAB_0011cccc;
                  }
LAB_0011ce3b:
                  if (s->img_buffer_end <= pbVar14) goto LAB_0011d098;
LAB_0011ce48:
                  uVar16 = (uint)bVar3;
                  if ((char)bVar3 < '\0') {
                    if (uVar16 == 0x80) {
                      iVar13 = stbi__get16be(s);
                    }
                    else {
                      iVar13 = uVar16 - 0x7f;
                    }
                    if ((int)uVar19 < iVar13) goto LAB_0011d098;
                    psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_9c);
                    if (psVar9 == (stbi_uc *)0x0) goto LAB_0011cccc;
                    if (0 < iVar13) {
                      iVar18 = 0;
                      do {
                        bVar3 = local_57[lVar2 + 1];
                        uVar16 = 0x80;
                        lVar6 = 0;
                        do {
                          if ((uVar16 & bVar3) != 0) {
                            psVar4[lVar6] = local_9c[lVar6];
                          }
                          lVar6 = lVar6 + 1;
                          uVar16 = uVar16 >> 1;
                        } while (lVar6 != 4);
                        iVar18 = iVar18 + 1;
                        psVar4 = psVar4 + 4;
                      } while (iVar18 != iVar13);
                    }
                  }
                  else {
                    iVar18 = uVar16 + 1;
                    local_88 = iVar18;
                    if (uVar19 <= uVar16) goto LAB_0011d098;
                    do {
                      psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],psVar4);
                      if (psVar9 == (stbi_uc *)0x0) goto LAB_0011cccc;
                      psVar4 = psVar4 + 4;
                      iVar18 = iVar18 + -1;
                      iVar13 = local_88;
                    } while (iVar18 != 0);
                  }
                  uVar16 = uVar19 - iVar13;
                  bVar20 = iVar13 <= (int)uVar19;
                  uVar19 = uVar16;
                } while (uVar16 != 0 && bVar20);
              }
            }
            lVar6 = local_70 + 1;
          } while (local_90 != lVar6);
          uVar12 = local_78 + 1;
        } while (uVar12 != local_80);
      }
LAB_0011ccdf:
      *local_68 = x;
      *local_60 = y;
      if (req_comp != 0) {
        req_comp_00 = req_comp;
      }
      if (req_comp == 0 && comp != (int *)0x0) {
        req_comp_00 = *comp;
      }
      puVar8 = stbi__convert_format(local_b8,4,req_comp_00,x,y);
      return puVar8;
    }
    pcVar7 = "outofmem";
  }
  else {
    pcVar7 = "too large";
  }
LAB_0011cc93:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar7;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   if (!result) return stbi__errpuc("outofmem", "Out of memory");
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}